

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O2

void skiwi::inline_fl_sub(asmcode *code,compiler_options *param_2)

{
  operand oVar1;
  operand local_44;
  operand local_40;
  operand local_3c;
  undefined8 local_38;
  
  local_40 = AH;
  local_44 = RAX;
  local_38 = 0xfffffffffffffff8;
  local_3c = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_40,&local_44,&local_3c,&local_38);
  local_40 = AH;
  local_44 = RBX;
  local_38 = 0xfffffffffffffff8;
  local_3c = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_40,&local_44,&local_3c,&local_38);
  local_38._0_4_ = MOVSD;
  local_44 = MEM_RAX;
  local_3c = DH;
  local_40 = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,&local_40,&local_44,(int *)&local_3c);
  local_38._0_4_ = MOVSD;
  local_44 = MEM_RBX;
  local_3c = DH;
  local_40 = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,&local_40,&local_44,(int *)&local_3c);
  local_38._0_4_ = SUBSD;
  local_44 = XMM1;
  local_40 = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,&local_40,&local_44);
  local_38._0_4_ = MOV;
  oVar1 = RAX;
  local_44 = MEM_RAX;
  local_40 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,&local_40,&local_44);
  local_38._0_4_ = MOV;
  local_44 = oVar1;
  local_40 = MEM_RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,&local_40,&local_44);
  local_3c = XMM0;
  local_44 = DH;
  local_40 = MEM_RBP;
  local_38._0_4_ = local_3c;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_38,&local_40,(int *)&local_44,&local_3c);
  local_38._0_4_ = MOV;
  local_44 = RBP;
  local_40 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,&local_40,&local_44);
  local_38._0_4_ = OR;
  local_3c = CL;
  local_44 = NUMBER;
  local_40 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,&local_40,&local_44,(int *)&local_3c);
  local_38 = (ulong)local_38._4_4_ << 0x20;
  local_40 = RBP;
  local_44 = NUMBER;
  local_3c = local_40;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,&local_40,&local_44,(int *)&local_3c);
  return;
}

Assistant:

void inline_fl_sub(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::AND, ASM::asmcode::RBX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::MEM_RAX, CELLS(1));
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM1, ASM::asmcode::MEM_RBX, CELLS(1));
  code.add(ASM::asmcode::SUBSD, ASM::asmcode::XMM0, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::MEM_RAX);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::MOVSD, MEM_ALLOC, CELLS(1), ASM::asmcode::XMM0);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  }